

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O2

void __thiscall cmOutputConverter::ComputeRelativePathTopBinary(cmOutputConverter *this)

{
  bool bVar1;
  string *cSubdir;
  string *cDir;
  cmStateSnapshot parent;
  cmStateSnapshot snapshot;
  cmStateSnapshot local_b8;
  cmStateSnapshot local_98;
  cmStateDirectory local_80;
  cmStateDirectory local_58;
  
  local_98.Position.Position = (this->StateSnapshot).Position.Position;
  local_98.State = (this->StateSnapshot).State;
  local_98.Position.Tree = (this->StateSnapshot).Position.Tree;
  cmStateSnapshot::GetBuildsystemDirectoryParent(&local_b8,&local_98);
  while( true ) {
    bVar1 = cmStateSnapshot::IsValid(&local_b8);
    if (!bVar1) break;
    cmStateSnapshot::GetDirectory(&local_80,&local_98);
    cSubdir = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_80);
    cmStateSnapshot::GetDirectory(&local_58,&local_b8);
    cDir = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_58);
    bVar1 = cmsys::SystemTools::IsSubDirectory(cSubdir,cDir);
    if (bVar1) {
      local_98.Position.Position = local_b8.Position.Position;
      local_98.State = local_b8.State;
      local_98.Position.Tree = local_b8.Position.Tree;
    }
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)&local_80,&local_b8);
    local_b8.Position.Position = (PositionType)local_80.Snapshot_.State;
    local_b8.State = (cmState *)local_80.DirectoryState.Tree;
    local_b8.Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_80.DirectoryState.Position;
  }
  cmStateSnapshot::GetDirectory(&local_80,&local_98);
  cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_80);
  std::__cxx11::string::_M_assign((string *)&this->RelativePathTopBinary);
  return;
}

Assistant:

void cmOutputConverter::ComputeRelativePathTopBinary()
{
  // Walk up the buildsystem directory tree to find the highest binary
  // directory that contains the current binary directory.
  cmStateSnapshot snapshot = this->StateSnapshot;
  for (cmStateSnapshot parent = snapshot.GetBuildsystemDirectoryParent();
       parent.IsValid(); parent = parent.GetBuildsystemDirectoryParent()) {
    if (cmSystemTools::IsSubDirectory(
          snapshot.GetDirectory().GetCurrentBinary(),
          parent.GetDirectory().GetCurrentBinary())) {
      snapshot = parent;
    }
  }

  this->RelativePathTopBinary = snapshot.GetDirectory().GetCurrentBinary();
}